

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_drm.c
# Opt level: O3

int drm_ioctl(int fd,int req,void *arg)

{
  uint uVar1;
  int *piVar2;
  char *pcVar3;
  ulong uVar4;
  
  uVar1 = ioctl(fd,(long)req);
  if (uVar1 == 0xffffffff) {
    piVar2 = __errno_location();
    do {
      if ((*piVar2 != 0xb) && (*piVar2 != 4)) {
        uVar4 = 0xffffffff;
        goto LAB_00172f51;
      }
      uVar1 = ioctl(fd,(long)req,arg);
    } while (uVar1 == 0xffffffff);
  }
  uVar4 = (ulong)uVar1;
LAB_00172f51:
  if (((byte)drm_debug & 4) != 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    _mpp_log_l(4,"mpp_drm","%x ret %d: %s\n","drm_ioctl",req,uVar4,pcVar3);
  }
  return (int)uVar4;
}

Assistant:

static int drm_ioctl(int fd, int req, void *arg)
{
    int ret;

    do {
        ret = ioctl(fd, req, arg);
    } while (ret == -1 && (errno == EINTR || errno == EAGAIN));

    drm_dbg_ioctl("%x ret %d: %s\n", req, ret, strerror(errno));

    return ret;
}